

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u32 uVar1;
  u8 *puVar2;
  ushort uVar3;
  ushort uVar4;
  u16 uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  ushort *puVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  u8 *puVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  u32 uVar19;
  uint local_8c;
  uint local_88;
  u8 *local_80;
  
  puVar2 = pPage->aData;
  uVar17 = (ulong)pPage->hdrOffset;
  uVar11 = pPage->cellOffset;
  uVar6 = pPage->nCell;
  uVar13 = (uint)uVar11 + (uint)uVar6 * 2;
  uVar1 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)puVar2[uVar17 + 7]) {
LAB_0014240a:
    local_8c = uVar1 - 4;
    uVar3 = *(ushort *)(puVar2 + uVar17 + 5) << 8 | *(ushort *)(puVar2 + uVar17 + 5) >> 8;
    local_80 = (u8 *)0x0;
    puVar15 = puVar2;
    uVar19 = uVar1;
    for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
      uVar4 = *(ushort *)(puVar2 + uVar18 * 2 + (ulong)uVar11) << 8 |
              *(ushort *)(puVar2 + uVar18 * 2 + (ulong)uVar11) >> 8;
      local_88 = (uint)uVar3;
      if ((uVar4 < local_88) ||
         (uVar16 = (uint)uVar4, uVar16 != local_8c && (int)local_8c <= (int)(uint)uVar4)) {
        iVar8 = 0x10b51;
        goto LAB_001425e5;
      }
      uVar5 = (*pPage->xCellSize)(pPage,puVar15 + uVar16);
      uVar19 = uVar19 - uVar5;
      if (((int)uVar19 < (int)local_88) || ((int)uVar1 < (int)((uint)uVar4 + (uint)uVar5))) {
        iVar8 = 0x10b57;
        goto LAB_001425e5;
      }
      *(ushort *)(puVar2 + uVar18 * 2 + (ulong)uVar11) = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
      if (local_80 == (u8 *)0x0) {
        if (uVar19 != uVar16) {
          puVar15 = (u8 *)pPage->pBt->pPager->pTmpSpace;
          memcpy(puVar15 + uVar3,puVar2 + uVar3,(long)(int)(uVar1 - uVar3));
          local_80 = puVar15;
          goto LAB_00142517;
        }
        local_80 = (u8 *)0x0;
      }
      else {
LAB_00142517:
        memcpy(puVar2 + uVar19,puVar15 + uVar16,(ulong)uVar5);
      }
    }
    puVar2[uVar17 + 7] = '\0';
    uVar16 = 0;
  }
  else {
    uVar3 = *(ushort *)(puVar2 + uVar17 + 1) << 8 | *(ushort *)(puVar2 + uVar17 + 1) >> 8;
    if ((int)(uVar1 - 4) < (int)(uint)uVar3) {
      iVar8 = 0x10b20;
      goto LAB_001425e5;
    }
    uVar16 = (uint)uVar3;
    if (uVar3 == 0) goto LAB_0014240a;
    uVar4 = *(ushort *)(puVar2 + uVar3) << 8 | *(ushort *)(puVar2 + uVar3) >> 8;
    if (uVar1 - 4 < (uint)uVar4) {
      iVar8 = 0x10b23;
      goto LAB_001425e5;
    }
    if ((uVar4 != 0) && ((puVar2[uVar4] != '\0' || (puVar2[(ulong)uVar4 + 1] != '\0'))))
    goto LAB_0014240a;
    uVar6 = *(ushort *)(puVar2 + uVar17 + 5) << 8 | *(ushort *)(puVar2 + uVar17 + 5) >> 8;
    iVar8 = uVar16 - uVar6;
    if (uVar16 < uVar6 || iVar8 == 0) {
      iVar8 = 0x10b2b;
      goto LAB_001425e5;
    }
    uVar7 = *(ushort *)(puVar2 + (ulong)uVar3 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar3 + 2) >> 8;
    uVar14 = (uint)uVar7;
    uVar9 = (uint)uVar7 + (uint)uVar3;
    if (uVar4 == 0) {
      uVar12 = 0;
      if ((int)uVar1 < (int)uVar9) {
        iVar8 = 0x10b34;
        goto LAB_001425e5;
      }
    }
    else {
      if (uVar4 < uVar9) {
        iVar8 = 0x10b2e;
        goto LAB_001425e5;
      }
      uVar3 = *(ushort *)(puVar2 + (ulong)uVar4 + 2) << 8 |
              *(ushort *)(puVar2 + (ulong)uVar4 + 2) >> 8;
      if ((int)uVar1 < (int)((uint)uVar3 + (uint)uVar4)) {
        iVar8 = 0x10b30;
        goto LAB_001425e5;
      }
      memmove(puVar2 + (uVar3 + uVar9),puVar2 + uVar9,(long)(int)(uVar4 - uVar9));
      uVar12 = (uint)uVar3;
      uVar14 = uVar7 + uVar12;
    }
    uVar19 = uVar14 + uVar6;
    memmove(puVar2 + uVar19,puVar2 + uVar6,(long)iVar8);
    for (puVar10 = (ushort *)(puVar2 + uVar11); puVar10 < puVar2 + uVar13; puVar10 = puVar10 + 1) {
      uVar11 = *puVar10 << 8 | *puVar10 >> 8;
      uVar9 = uVar14;
      if ((uVar11 < uVar16) || (uVar9 = uVar12, (uint)uVar11 < (uint)uVar4)) {
        uVar11 = uVar11 + (short)uVar9;
        *puVar10 = uVar11 * 0x100 | uVar11 >> 8;
      }
    }
    uVar16 = (uint)puVar2[uVar17 + 7];
  }
  if (uVar16 + (uVar19 - uVar13) == pPage->nFree) {
    *(ushort *)(puVar2 + uVar17 + 5) = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
    (puVar2 + uVar17 + 1)[0] = '\0';
    (puVar2 + uVar17 + 1)[1] = '\0';
    memset(puVar2 + uVar13,0,(long)(int)(uVar19 - uVar13));
    return 0;
  }
  iVar8 = 0x10b6a;
LAB_001425e5:
  iVar8 = sqlite3CorruptError(iVar8);
  return iVar8;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( NEVER(iFree+sz>usableSize) ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellStart || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellStart && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellStart || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellStart );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}